

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O3

void __thiscall
QPDFWriter::QPDFWriter(QPDFWriter *this,QPDF *pdf,char *description,FILE *file,bool close_file)

{
  Members *this_00;
  
  this_00 = (Members *)operator_new(0x430);
  Members::Members(this_00,pdf);
  (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<QPDFWriter::Members*>
            (&(this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,this_00);
  setOutputFile(this,description,file,close_file);
  return;
}

Assistant:

QPDFWriter::QPDFWriter(QPDF& pdf, char const* description, FILE* file, bool close_file) :
    m(new Members(pdf))
{
    setOutputFile(description, file, close_file);
}